

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

optional<slang::TimeUnit> __thiscall slang::parsing::Lexer::lexTimeLiteral(Lexer *this)

{
  char *pcVar1;
  ushort uVar2;
  ushort uVar3;
  long lStack_8;
  
  pcVar1 = this->sourceBuffer;
  uVar2 = 0;
  switch(*pcVar1) {
  case 'm':
    if (pcVar1[1] != 's') break;
    uVar2 = 1;
LAB_003c1103:
    lStack_8 = 2;
    goto LAB_003c110f;
  case 'n':
    if (pcVar1[1] == 's') {
      uVar2 = 3;
      goto LAB_003c1103;
    }
    break;
  case 'o':
  case 'q':
  case 'r':
  case 't':
    break;
  case 'p':
    if (pcVar1[1] == 's') {
      uVar2 = 4;
      goto LAB_003c1103;
    }
    break;
  case 's':
    lStack_8 = 1;
    uVar2 = 0;
LAB_003c110f:
    this->sourceBuffer = pcVar1 + lStack_8;
    uVar3 = 0x100;
    goto LAB_003c111b;
  case 'u':
    if (pcVar1[1] == 's') {
      uVar2 = 2;
      goto LAB_003c1103;
    }
    break;
  default:
    uVar3 = 0;
    if (*pcVar1 != 'f') goto LAB_003c111b;
    if (pcVar1[1] == 's') {
      uVar2 = 5;
      goto LAB_003c1103;
    }
  }
  uVar2 = 0;
  uVar3 = 0;
LAB_003c111b:
  return (_Optional_base<slang::TimeUnit,_true,_true>)
         (_Optional_base<slang::TimeUnit,_true,_true>)(uVar3 | uVar2);
}

Assistant:

char peek() const { return *sourceBuffer; }